

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O3

void __thiscall
OpenMPDistScheduleClause::generateDOT
          (OpenMPDistScheduleClause *this,ofstream *dot_file,int depth,int index,string *parent_node
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_t sVar8;
  uint uVar9;
  long *plVar10;
  ulong *puVar11;
  size_type *psVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  undefined8 uVar16;
  string __str_1;
  string __str;
  string chunk_size;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string clause_kind;
  string current_line;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ofstream *local_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  char *local_90;
  undefined8 local_88;
  char local_80;
  undefined7 uStack_7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_90 = &local_80;
  local_88 = 0;
  local_80 = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_198 = dot_file;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)depth);
  uVar15 = -depth;
  if (0 < depth) {
    uVar15 = depth;
  }
  uVar14 = 1;
  if (9 < uVar15) {
    uVar13 = (ulong)uVar15;
    uVar4 = 4;
    do {
      uVar14 = uVar4;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0016fb8b;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0016fb8b;
      }
      if (uVar9 < 10000) goto LAB_0016fb8b;
      uVar13 = uVar13 / 10000;
      uVar4 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_0016fb8b:
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar14 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_1b8),uVar14,uVar15);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x1a688b);
  local_190 = &local_180;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_180 = *plVar10;
    lStack_178 = plVar6[3];
  }
  else {
    local_180 = *plVar10;
    local_190 = (long *)*plVar6;
  }
  local_188 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_120 = *puVar11;
    lStack_118 = plVar6[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar11;
    local_130 = (ulong *)*plVar6;
  }
  local_128 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar15 = -index;
  if (0 < index) {
    uVar15 = index;
  }
  uVar14 = 1;
  if (9 < uVar15) {
    uVar13 = (ulong)uVar15;
    uVar4 = 4;
    do {
      uVar14 = uVar4;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0016fcd8;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0016fcd8;
      }
      if (uVar9 < 10000) goto LAB_0016fcd8;
      uVar13 = uVar13 / 10000;
      uVar4 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_0016fcd8:
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar14 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1d8._M_dataplus._M_p + ((uint)index >> 0x1f),uVar14,uVar15);
  uVar13 = 0xf;
  if (local_130 != &local_120) {
    uVar13 = local_120;
  }
  if (uVar13 < local_1d8._M_string_length + local_128) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      uVar16 = local_1d8.field_2._M_allocated_capacity;
    }
    if (local_1d8._M_string_length + local_128 <= (ulong)uVar16) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_130);
      goto LAB_0016fd78;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_1d8._M_dataplus._M_p);
LAB_0016fd78:
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar12 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_d0.field_2._M_allocated_capacity = *psVar12;
    local_d0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar12;
    local_d0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_d0._M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)psVar12 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  std::operator+(&local_1d8,&local_70,parent_node);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_1a8 = *plVar10;
    lStack_1a0 = plVar6[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar10;
    local_1b8 = (long *)*plVar6;
  }
  local_1b0 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b8,(ulong)local_d0._M_dataplus._M_p);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_180 = *plVar10;
    lStack_178 = plVar6[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *plVar10;
    local_190 = (long *)*plVar6;
  }
  local_188 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_120 = *puVar11;
    lStack_118 = plVar6[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar11;
    local_130 = (ulong *)*plVar6;
  }
  local_128 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_130);
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_90;
  if (local_90 == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(*(long *)local_198 + -0x18));
  }
  else {
    sVar8 = strlen(local_90);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,sVar8);
  }
  std::__cxx11::string::append((char *)&local_70);
  local_128 = 0;
  local_120 = local_120 & 0xffffffffffffff00;
  local_130 = &local_120;
  if ((this->dist_schedule_kind == OMPC_DIST_SCHEDULE_KIND_static) &&
     (std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)0x0,0x1a6868), local_128 != 0)) {
    local_190 = &local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    std::__cxx11::string::append((char *)&local_190);
    std::operator+(&local_150,&local_70,&local_d0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_160 = *plVar10;
      lStack_158 = plVar6[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar10;
      local_170 = (long *)*plVar6;
    }
    local_168 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_190);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1d8.field_2._M_allocated_capacity = *psVar12;
      local_1d8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar12;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_1a8 = *plVar10;
      lStack_1a0 = plVar6[3];
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8 = *plVar10;
      local_1b8 = (long *)*plVar6;
    }
    local_1b0 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_1b8);
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    paVar1 = &local_150.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = local_90;
    if (local_90 == (char *)0x0) {
      std::ios::clear((int)local_198 + (int)*(undefined8 *)(*(long *)local_198 + -0x18));
    }
    else {
      sVar8 = strlen(local_90);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,sVar8);
    }
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_190);
    local_b0 = &local_a0;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_a0 = *plVar10;
      lStack_98 = plVar6[3];
    }
    else {
      local_a0 = *plVar10;
      local_b0 = (long *)*plVar6;
    }
    local_a8 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_110.field_2._M_allocated_capacity = *psVar12;
      local_110.field_2._8_8_ = plVar6[3];
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar12;
      local_110._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_110._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_190);
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_150.field_2._M_allocated_capacity = *psVar12;
      local_150.field_2._8_8_ = plVar6[3];
      local_150._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar12;
      local_150._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_150._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_170 = &local_160;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_160 = *plVar10;
      lStack_158 = plVar6[3];
    }
    else {
      local_160 = *plVar10;
      local_170 = (long *)*plVar6;
    }
    local_168 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_130);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    puVar11 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_1d8.field_2._M_allocated_capacity = *puVar11;
      local_1d8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar11;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_1a8 = *plVar10;
      lStack_1a0 = plVar6[3];
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8 = *plVar10;
      local_1b8 = (long *)*plVar6;
    }
    local_1b0 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_1b8);
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar1) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    pcVar3 = local_90;
    if (local_90 == (char *)0x0) {
      std::ios::clear((int)local_198 + (int)*(undefined8 *)(*(long *)local_198 + -0x18));
    }
    else {
      sVar8 = strlen(local_90);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,sVar8);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
  }
  local_190 = &local_180;
  pcVar2 = (this->chunk_size)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar2,pcVar2 + (this->chunk_size)._M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)&local_190);
  if (iVar5 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_130);
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    std::__cxx11::string::append((char *)&local_1b8);
    std::operator+(&local_110,&local_70,&local_d0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_150.field_2._M_allocated_capacity = *psVar12;
      local_150.field_2._8_8_ = plVar6[3];
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar12;
      local_150._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_150._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1b8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_160 = *plVar10;
      lStack_158 = plVar6[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar10;
      local_170 = (long *)*plVar6;
    }
    local_168 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1d8.field_2._M_allocated_capacity = *psVar12;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar12;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = local_90;
    if (local_90 == (char *)0x0) {
      std::ios::clear((int)local_198 + (int)*(undefined8 *)(*(long *)local_198 + -0x18));
    }
    else {
      sVar8 = strlen(local_90);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,sVar8);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    std::__cxx11::string::append((char *)local_50);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_1b8);
    local_f0 = &local_e0;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_e0 = *plVar10;
      lStack_d8 = plVar6[3];
    }
    else {
      local_e0 = *plVar10;
      local_f0 = (long *)*plVar6;
    }
    local_e8 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_a0 = *plVar10;
      lStack_98 = plVar6[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar10;
      local_b0 = (long *)*plVar6;
    }
    local_a8 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_1b8);
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_110.field_2._M_allocated_capacity = *psVar12;
      local_110.field_2._8_8_ = plVar6[3];
      local_110._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar12;
      local_110._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_110._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_150.field_2._M_allocated_capacity = *psVar12;
      local_150.field_2._8_8_ = plVar6[3];
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar12;
      local_150._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_150._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_160 = *plVar10;
      lStack_158 = plVar6[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar10;
      local_170 = (long *)*plVar6;
    }
    local_168 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
    puVar11 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_1d8.field_2._M_allocated_capacity = *puVar11;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar11;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    pcVar3 = local_90;
    if (local_90 == (char *)0x0) {
      std::ios::clear((int)local_198 + (int)*(undefined8 *)(*(long *)local_198 + -0x18));
    }
    else {
      sVar8 = strlen(local_90);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,sVar8);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return;
}

Assistant:

void OpenMPDistScheduleClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "dist_schedule_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDistScheduleClauseKind kind = this->getKind();
    std::string parameter_string;
    switch (kind) {
        case OMPC_DIST_SCHEDULE_KIND_static:
            parameter_string = "static";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

    std::string chunk_size = this->getChunkSize();
    if (chunk_size != "") {
        parameter_string = chunk_size;
        std::string chunk_size_name = clause_kind + "_chunk_size";
        current_line = indent + clause_kind + " -- " + chunk_size_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + chunk_size_name + " [label = \"" + chunk_size_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    }; 
}